

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O3

bool __thiscall zmq::radix_tree_t::add(radix_tree_t *this,uchar *key_,size_t key_size_)

{
  uint uVar1;
  int iVar2;
  node_t nVar3;
  node_t node_;
  node_t nVar4;
  size_t prefix_length_;
  node_t parent_node;
  node_t current_node;
  match_result_t match_result;
  node_t local_78;
  node_t local_70;
  match_result_t local_68;
  
  match(&local_68,this,key_,key_size_,false);
  local_70._data = local_68._current_node._data;
  local_78._data = local_68._parent_node._data;
  uVar1 = *(uint *)(local_68._current_node._data + 4);
  if (key_size_ - local_68._key_bytes_matched == 0) {
    prefix_length_ = uVar1 - local_68._prefix_bytes_matched;
    if (prefix_length_ == 0) {
      this->_size = this->_size + 1;
      uVar1 = *(uint *)local_68._current_node._data;
      *(uint *)local_68._current_node._data = uVar1 + 1;
      return uVar1 == 0;
    }
    nVar3 = make_node((ulong)*(uint *)local_68._current_node._data,prefix_length_,
                      (ulong)*(uint *)(local_68._current_node._data + 8));
    uVar1 = *(uint *)(nVar3._data + 4);
    memcpy(nVar3._data + 0xc,local_68._current_node._data + local_68._prefix_bytes_matched + 0xc,
           (ulong)uVar1);
    memcpy(nVar3._data + (ulong)uVar1 + 0xc,
           local_68._current_node._data + (ulong)*(uint *)(local_68._current_node._data + 4) + 0xc,
           (ulong)*(uint *)(nVar3._data + 8));
    memcpy(nVar3._data + (ulong)*(uint *)(nVar3._data + 8) + (ulong)*(uint *)(nVar3._data + 4) + 0xc
           ,local_68._current_node._data +
            (ulong)*(uint *)(local_68._current_node._data + 8) +
            (ulong)*(uint *)(local_68._current_node._data + 4) + 0xc,
           (ulong)*(uint *)(nVar3._data + 8) << 3);
    node_t::resize(&local_70,local_68._prefix_bytes_matched,1);
    node_t::set_first_byte_at(&local_70,0,nVar3._data[0xc]);
    node_t::set_node_at(&local_70,0,nVar3);
    local_70._data[0] = '\x01';
    local_70._data[1] = '\0';
    local_70._data[2] = '\0';
    local_70._data[3] = '\0';
    this->_size = this->_size + 1;
    nVar4._data = local_70._data;
  }
  else {
    nVar3 = make_node(1,key_size_ - local_68._key_bytes_matched,0);
    if (uVar1 == local_68._prefix_bytes_matched) {
      memcpy(nVar3._data + 0xc,key_ + local_68._key_bytes_matched,(ulong)*(uint *)(nVar3._data + 4))
      ;
      node_t::resize(&local_70,(ulong)*(uint *)(local_68._current_node._data + 4),
                     (ulong)(*(uint *)(local_68._current_node._data + 8) + 1));
      nVar4._data = local_70._data;
      uVar1 = *(uint *)(local_70._data + 8);
      memmove(local_70._data + (ulong)uVar1 + (ulong)*(uint *)(local_70._data + 4) + 0xc,
              local_70._data + (ulong)uVar1 + (ulong)*(uint *)(local_70._data + 4) + 0xb,
              (ulong)(uVar1 - 1) << 3);
      iVar2 = *(int *)(nVar4._data + 8);
      node_t::set_first_byte_at(&local_70,(ulong)(iVar2 - 1),key_[local_68._key_bytes_matched]);
      node_t::set_node_at(&local_70,(ulong)(iVar2 - 1),nVar3);
      if (*(int *)(nVar4._data + 4) == 0) {
        (this->_root)._data = nVar4._data;
      }
      else {
        node_t::set_node_at(&local_78,local_68._edge_index,nVar4);
      }
      this->_size = this->_size + 1;
      return true;
    }
    node_ = make_node((ulong)*(uint *)local_68._current_node._data,
                      *(uint *)(local_68._current_node._data + 4) - local_68._prefix_bytes_matched,
                      (ulong)*(uint *)(local_68._current_node._data + 8));
    memcpy(nVar3._data + 0xc,key_ + local_68._key_bytes_matched,(ulong)*(uint *)(nVar3._data + 4));
    uVar1 = *(uint *)(node_._data + 4);
    memcpy(node_._data + 0xc,local_68._current_node._data + local_68._prefix_bytes_matched + 0xc,
           (ulong)uVar1);
    memcpy(node_._data + (ulong)uVar1 + 0xc,
           local_68._current_node._data + (ulong)*(uint *)(local_68._current_node._data + 4) + 0xc,
           (ulong)*(uint *)(node_._data + 8));
    memcpy(node_._data + (ulong)*(uint *)(node_._data + 8) + (ulong)*(uint *)(node_._data + 4) + 0xc
           ,local_68._current_node._data +
            (ulong)*(uint *)(local_68._current_node._data + 8) +
            (ulong)*(uint *)(local_68._current_node._data + 4) + 0xc,
           (ulong)*(uint *)(node_._data + 8) << 3);
    node_t::resize(&local_70,local_68._prefix_bytes_matched,2);
    nVar4._data = local_70._data;
    local_70._data[0] = '\0';
    local_70._data[1] = '\0';
    local_70._data[2] = '\0';
    local_70._data[3] = '\0';
    node_t::set_first_byte_at(&local_70,0,nVar3._data[0xc]);
    node_t::set_node_at(&local_70,0,nVar3);
    node_t::set_first_byte_at(&local_70,1,node_._data[0xc]);
    node_t::set_node_at(&local_70,1,node_);
    this->_size = this->_size + 1;
  }
  node_t::set_node_at(&local_78,local_68._edge_index,nVar4);
  return true;
}

Assistant:

bool zmq::radix_tree_t::add (const unsigned char *key_, size_t key_size_)
{
    const match_result_t match_result = match (key_, key_size_);
    const size_t key_bytes_matched = match_result._key_bytes_matched;
    const size_t prefix_bytes_matched = match_result._prefix_bytes_matched;
    const size_t edge_index = match_result._edge_index;
    node_t current_node = match_result._current_node;
    node_t parent_node = match_result._parent_node;

    if (key_bytes_matched != key_size_) {
        // Not all characters match, we might have to split the node.
        if (prefix_bytes_matched == current_node.prefix_length ()) {
            // The mismatch is at one of the outgoing edges, so we
            // create an edge from the current node to a new leaf node
            // that has the rest of the key as the prefix.
            node_t key_node = make_node (1, key_size_ - key_bytes_matched, 0);
            key_node.set_prefix (key_ + key_bytes_matched);

            // Reallocate for one more edge.
            current_node.resize (current_node.prefix_length (),
                                 current_node.edgecount () + 1);

            // Make room for the new edge. We need to shift the chunk
            // of node pointers one byte to the right. Since resize()
            // increments the edgecount by 1, node_pointers() tells us the
            // destination address. The chunk of node pointers starts
            // at one byte to the left of this destination.
            //
            // Since the regions can overlap, we use memmove.
            memmove (current_node.node_pointers (),
                     current_node.node_pointers () - 1,
                     (current_node.edgecount () - 1) * sizeof (void *));

            // Add an edge to the new node.
            current_node.set_edge_at (current_node.edgecount () - 1,
                                      key_[key_bytes_matched], key_node);

            // We need to update all pointers to the current node
            // after the call to resize().
            if (current_node.prefix_length () == 0)
                _root._data = current_node._data;
            else
                parent_node.set_node_at (edge_index, current_node);
            ++_size;
            return true;
        }

        // There was a mismatch, so we need to split this node.
        //
        // Create two nodes that will be reachable from the parent.
        // One node will have the rest of the characters from the key,
        // and the other node will have the rest of the characters
        // from the current node's prefix.
        node_t key_node = make_node (1, key_size_ - key_bytes_matched, 0);
        node_t split_node =
          make_node (current_node.refcount (),
                     current_node.prefix_length () - prefix_bytes_matched,
                     current_node.edgecount ());

        // Copy the prefix chunks to the new nodes.
        key_node.set_prefix (key_ + key_bytes_matched);
        split_node.set_prefix (current_node.prefix () + prefix_bytes_matched);

        // Copy the current node's edges to the new node.
        split_node.set_first_bytes (current_node.first_bytes ());
        split_node.set_node_pointers (current_node.node_pointers ());

        // Resize the current node to accommodate a prefix comprising
        // the matched characters and 2 outgoing edges to the above
        // nodes. Set the refcount to 0 since this node doesn't hold a
        // key.
        current_node.resize (prefix_bytes_matched, 2);
        current_node.set_refcount (0);

        // Add links to the new nodes. We don't need to copy the
        // prefix since resize() retains it in the current node.
        current_node.set_edge_at (0, key_node.prefix ()[0], key_node);
        current_node.set_edge_at (1, split_node.prefix ()[0], split_node);

        ++_size;
        parent_node.set_node_at (edge_index, current_node);
        return true;
    }

    // All characters in the key match, but we still might need to split.
    if (prefix_bytes_matched != current_node.prefix_length ()) {
        // All characters in the key match, but not all characters
        // from the current node's prefix match.

        // Create a node that contains the rest of the characters from
        // the current node's prefix and the outgoing edges from the
        // current node.
        node_t split_node =
          make_node (current_node.refcount (),
                     current_node.prefix_length () - prefix_bytes_matched,
                     current_node.edgecount ());
        split_node.set_prefix (current_node.prefix () + prefix_bytes_matched);
        split_node.set_first_bytes (current_node.first_bytes ());
        split_node.set_node_pointers (current_node.node_pointers ());

        // Resize the current node to hold only the matched characters
        // from its prefix and one edge to the new node.
        current_node.resize (prefix_bytes_matched, 1);

        // Add an edge to the split node and set the refcount to 1
        // since this key wasn't inserted earlier. We don't need to
        // set the prefix because the first `prefix_bytes_matched` bytes
        // in the prefix are preserved by resize().
        current_node.set_edge_at (0, split_node.prefix ()[0], split_node);
        current_node.set_refcount (1);

        ++_size;
        parent_node.set_node_at (edge_index, current_node);
        return true;
    }

    zmq_assert (key_bytes_matched == key_size_);
    zmq_assert (prefix_bytes_matched == current_node.prefix_length ());

    ++_size;
    current_node.set_refcount (current_node.refcount () + 1);
    return current_node.refcount () == 1;
}